

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O1

REF_STATUS ref_clump_between(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_GRID_conflict pRVar3;
  uint uVar4;
  FILE *__s;
  undefined8 uVar5;
  char *pcVar6;
  REF_INT RVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  REF_DICT node_dict;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  REF_INT nodes [27];
  REF_DICT local_e0;
  REF_DICT local_d8;
  uint local_cc;
  REF_DICT local_c8;
  REF_DICT local_c0;
  REF_GRID_conflict local_b8;
  char *local_b0;
  REF_INT local_a8 [30];
  
  uVar4 = ref_dict_create(&local_e0);
  if (uVar4 == 0) {
    uVar4 = ref_dict_create(&local_c0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xc4,
             "ref_clump_between",(ulong)uVar4,"create tris");
      return uVar4;
    }
    uVar4 = ref_dict_create(&local_c8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xc5,
             "ref_clump_between",(ulong)uVar4,"create tets");
      return uVar4;
    }
    pRVar1 = ref_grid->cell[3];
    RVar7 = -1;
    uVar10 = 0xffffffff;
    if (-1 < node0) {
      uVar10 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        uVar10 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    iVar9 = (int)uVar10;
    local_b8 = ref_grid;
    local_cc = node1;
    local_b0 = filename;
    local_d8 = local_c0;
    if (iVar9 != -1) {
      RVar7 = pRVar1->ref_adj->item[iVar9].ref;
    }
    while (iVar9 != -1) {
      uVar4 = ref_cell_nodes(pRVar1,RVar7,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0xca,"ref_clump_between",(ulong)uVar4,"n");
        return uVar4;
      }
      uVar4 = ref_dict_store(local_d8,RVar7,0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0xcb,"ref_clump_between",(ulong)uVar4,"store");
        return uVar4;
      }
      if (0 < pRVar1->node_per) {
        lVar8 = 0;
        do {
          uVar4 = ref_dict_store(local_e0,local_a8[lVar8],0);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xcd,"ref_clump_between",(ulong)uVar4,"store");
            return uVar4;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pRVar1->node_per);
      }
      pRVar2 = pRVar1->ref_adj->item;
      iVar9 = pRVar2[(int)uVar10].next;
      uVar10 = (ulong)iVar9;
      if (uVar10 == 0xffffffffffffffff) {
        RVar7 = -1;
      }
      else {
        RVar7 = pRVar2[uVar10].ref;
      }
    }
    uVar10 = 0xffffffff;
    if (-1 < (int)local_cc) {
      uVar10 = 0xffffffff;
      if ((int)local_cc < pRVar1->ref_adj->nnode) {
        uVar10 = (ulong)(uint)pRVar1->ref_adj->first[local_cc];
      }
    }
    if ((int)uVar10 != -1) {
      RVar7 = pRVar1->ref_adj->item[(int)uVar10].ref;
      do {
        uVar4 = ref_cell_nodes(pRVar1,RVar7,local_a8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0xd0,"ref_clump_between",(ulong)uVar4,"n");
          return uVar4;
        }
        uVar4 = ref_dict_store(local_d8,RVar7,0);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0xd1,"ref_clump_between",(ulong)uVar4,"store");
          return uVar4;
        }
        if (0 < pRVar1->node_per) {
          lVar8 = 0;
          do {
            uVar4 = ref_dict_store(local_e0,local_a8[lVar8],0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xd3,"ref_clump_between",(ulong)uVar4,"store");
              return uVar4;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar9 = pRVar2[(int)uVar10].next;
        uVar10 = (ulong)iVar9;
        if (uVar10 == 0xffffffffffffffff) {
          RVar7 = -1;
        }
        else {
          RVar7 = pRVar2[uVar10].ref;
        }
      } while (iVar9 != -1);
    }
    pRVar1 = local_b8->cell[8];
    RVar7 = -1;
    uVar10 = 0xffffffff;
    if (-1 < node0) {
      uVar10 = 0xffffffff;
      if (node0 < pRVar1->ref_adj->nnode) {
        uVar10 = (ulong)(uint)pRVar1->ref_adj->first[(uint)node0];
      }
    }
    iVar9 = (int)uVar10;
    local_d8 = local_c8;
    if (iVar9 != -1) {
      RVar7 = pRVar1->ref_adj->item[iVar9].ref;
    }
    while (iVar9 != -1) {
      uVar4 = ref_cell_nodes(pRVar1,RVar7,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0xd8,"ref_clump_between",(ulong)uVar4,"n");
        return uVar4;
      }
      uVar4 = ref_dict_store(local_d8,RVar7,0);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0xd9,"ref_clump_between",(ulong)uVar4,"store");
        return uVar4;
      }
      if (0 < pRVar1->node_per) {
        lVar8 = 0;
        do {
          uVar4 = ref_dict_store(local_e0,local_a8[lVar8],0);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xdb,"ref_clump_between",(ulong)uVar4,"store");
            return uVar4;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pRVar1->node_per);
      }
      pRVar2 = pRVar1->ref_adj->item;
      iVar9 = pRVar2[(int)uVar10].next;
      uVar10 = (ulong)iVar9;
      if (uVar10 == 0xffffffffffffffff) {
        RVar7 = -1;
      }
      else {
        RVar7 = pRVar2[uVar10].ref;
      }
    }
    uVar10 = 0xffffffff;
    if (-1 < (int)local_cc) {
      uVar10 = 0xffffffff;
      if ((int)local_cc < pRVar1->ref_adj->nnode) {
        uVar10 = (ulong)(uint)pRVar1->ref_adj->first[local_cc];
      }
    }
    if ((int)uVar10 != -1) {
      RVar7 = pRVar1->ref_adj->item[(int)uVar10].ref;
      do {
        uVar4 = ref_cell_nodes(pRVar1,RVar7,local_a8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0xde,"ref_clump_between",(ulong)uVar4,"n");
          return uVar4;
        }
        uVar4 = ref_dict_store(local_d8,RVar7,0);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
                 0xdf,"ref_clump_between",(ulong)uVar4,"store");
          return uVar4;
        }
        if (0 < pRVar1->node_per) {
          lVar8 = 0;
          do {
            uVar4 = ref_dict_store(local_e0,local_a8[lVar8],0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                     ,0xe1,"ref_clump_between",(ulong)uVar4,"store");
              return uVar4;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < pRVar1->node_per);
        }
        pRVar2 = pRVar1->ref_adj->item;
        iVar9 = pRVar2[(int)uVar10].next;
        uVar10 = (ulong)iVar9;
        if (uVar10 == 0xffffffffffffffff) {
          RVar7 = -1;
        }
        else {
          RVar7 = pRVar2[uVar10].ref;
        }
      } while (iVar9 != -1);
    }
    pcVar6 = local_b0;
    __s = fopen(local_b0,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",pcVar6);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xe6,
             "ref_clump_between","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n",0x2b,1,__s);
    pRVar3 = local_b8;
    uVar4 = ref_clump_zone_around
                      ((FILE *)__s,local_b8->cell[3],local_c0,"fetriangle",local_e0,local_b8->node,
                       node0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xf0,
             "ref_clump_between",(ulong)uVar4,"zone");
      return uVar4;
    }
    uVar4 = ref_clump_zone_around
                      ((FILE *)__s,pRVar3->cell[8],local_c8,"fetetrahedron",local_e0,pRVar3->node,
                       node0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xf7,
             "ref_clump_between",(ulong)uVar4,"zone");
      return uVar4;
    }
    fclose(__s);
    uVar4 = ref_dict_free(local_c8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xfb,
             "ref_clump_between",(ulong)uVar4,"free tet");
      return uVar4;
    }
    uVar4 = ref_dict_free(local_c0);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",0xfc,
             "ref_clump_between",(ulong)uVar4,"free tris");
      return uVar4;
    }
    uVar4 = ref_dict_free(local_e0);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar6 = "free nodes";
    uVar5 = 0xfd;
  }
  else {
    pcVar6 = "create nodes";
    uVar5 = 0xc3;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar5,
         "ref_clump_between",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1, const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}